

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.cpp
# Opt level: O3

SRes crnlib::LzmaDec_DecodeToDic
               (CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  UInt32 UVar2;
  UInt16 *pUVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  uint uVar8;
  ELzmaDummy EVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  Byte *pBVar14;
  ulong uVar15;
  long lVar16;
  SizeT inSize;
  bool bVar17;
  undefined1 auVar18 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  int iVar39;
  int iVar42;
  undefined1 auVar40 [16];
  int iVar43;
  undefined1 auVar41 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar46 [16];
  long lVar21;
  
  inSize = *srcLen;
  *srcLen = 0;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  uVar8 = p->remainLen;
  if (uVar8 != 0x112) {
    buf = p->tempBuf;
    do {
      auVar6 = _DAT_001a7020;
      if (p->needFlush != 0) {
        uVar11 = p->tempBufSize;
        if (inSize == 0) {
          inSize = 0;
        }
        else {
          uVar12 = 5;
          if (5 < uVar11) {
            uVar12 = (ulong)uVar11;
          }
          if (uVar11 < 5) {
            lVar21 = inSize - 1;
            lVar7 = 0;
            do {
              lVar16 = lVar7;
              BVar1 = src[lVar16];
              p->tempBufSize = uVar11 + (int)lVar16 + 1;
              buf[lVar16 + (ulong)uVar11] = BVar1;
              *srcLen = *srcLen + 1;
              if (lVar21 == lVar16) {
                inSize = 0;
                break;
              }
              inSize = inSize - 1;
              lVar7 = lVar16 + 1;
            } while (uVar12 - uVar11 != lVar16 + 1);
            src = src + lVar16 + 1;
            uVar11 = uVar11 + (int)lVar16 + 1;
          }
        }
        if (uVar11 < 5) goto LAB_0019cc43;
        if (*buf != '\0') {
          return 1;
        }
        uVar11 = *(uint *)(p->tempBuf + 1);
        p->code = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                  uVar11 << 0x18;
        p->range = 0xffffffff;
        p->needFlush = 0;
        p->tempBufSize = 0;
      }
      uVar12 = p->dicPos;
      if (dicLimit <= uVar12) {
        if (uVar8 != 0) {
          if (finishMode == LZMA_FINISH_ANY) {
LAB_0019cc08:
            *status = LZMA_STATUS_NOT_FINISHED;
            return 0;
          }
          goto LAB_0019cbf6;
        }
        if (p->code == 0) {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
          return 0;
        }
        if (finishMode == LZMA_FINISH_ANY) goto LAB_0019cc08;
      }
      if (p->needInitState != 0) {
        uVar8 = 0x300 << ((char)(p->prop).lp + (char)(p->prop).lc & 0x1fU);
        pUVar3 = p->probs;
        lVar21 = (ulong)uVar8 + 0x735;
        auVar18._8_4_ = (int)lVar21;
        auVar18._0_8_ = lVar21;
        auVar18._12_4_ = (int)((ulong)lVar21 >> 0x20);
        auVar18 = auVar18 ^ auVar6;
        uVar13 = 0;
        auVar20 = _DAT_001a7010;
        auVar22 = _DAT_001a70c0;
        auVar23 = _DAT_001a70b0;
        auVar24 = _DAT_001a70a0;
        do {
          auVar25 = auVar20 ^ auVar6;
          iVar39 = auVar18._0_4_;
          iVar38 = -(uint)(iVar39 < auVar25._0_4_);
          iVar10 = auVar18._4_4_;
          auVar26._4_4_ = -(uint)(iVar10 < auVar25._4_4_);
          iVar43 = auVar18._8_4_;
          iVar42 = -(uint)(iVar43 < auVar25._8_4_);
          iVar19 = auVar18._12_4_;
          auVar26._12_4_ = -(uint)(iVar19 < auVar25._12_4_);
          auVar35._4_4_ = iVar38;
          auVar35._0_4_ = iVar38;
          auVar35._8_4_ = iVar42;
          auVar35._12_4_ = iVar42;
          auVar44 = pshuflw(in_XMM8,auVar35,0xe8);
          auVar28._4_4_ = -(uint)(auVar25._4_4_ == iVar10);
          auVar28._12_4_ = -(uint)(auVar25._12_4_ == iVar19);
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar46 = pshuflw(in_XMM9,auVar28,0xe8);
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          auVar45 = pshuflw(auVar44,auVar26,0xe8);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar25 = (auVar45 | auVar46 & auVar44) ^ auVar25;
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pUVar3[uVar13] = 0x400;
          }
          auVar26 = auVar28 & auVar35 | auVar26;
          auVar25 = packssdw(auVar26,auVar26);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar25 = packssdw(auVar25 ^ auVar45,auVar25 ^ auVar45);
          if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
            pUVar3[uVar13 + 1] = 0x400;
          }
          auVar25 = auVar22 ^ auVar6;
          iVar38 = -(uint)(iVar39 < auVar25._0_4_);
          auVar40._4_4_ = -(uint)(iVar10 < auVar25._4_4_);
          iVar42 = -(uint)(iVar43 < auVar25._8_4_);
          auVar40._12_4_ = -(uint)(iVar19 < auVar25._12_4_);
          auVar27._4_4_ = iVar38;
          auVar27._0_4_ = iVar38;
          auVar27._8_4_ = iVar42;
          auVar27._12_4_ = iVar42;
          auVar34._4_4_ = -(uint)(auVar25._4_4_ == iVar10);
          auVar34._12_4_ = -(uint)(auVar25._12_4_ == iVar19);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar25 = auVar34 & auVar27 | auVar40;
          auVar25 = packssdw(auVar25,auVar25);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar25 = packssdw(auVar25 ^ auVar4,auVar25 ^ auVar4);
          if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pUVar3[uVar13 + 2] = 0x400;
          }
          auVar28 = pshufhw(auVar27,auVar27,0x84);
          auVar35 = pshufhw(auVar34,auVar34,0x84);
          auVar26 = pshufhw(auVar28,auVar40,0x84);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = (auVar26 | auVar35 & auVar28) ^ auVar29;
          auVar28 = packssdw(auVar29,auVar29);
          if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pUVar3[uVar13 + 3] = 0x400;
          }
          auVar28 = auVar23 ^ auVar6;
          iVar38 = -(uint)(iVar39 < auVar28._0_4_);
          auVar31._4_4_ = -(uint)(iVar10 < auVar28._4_4_);
          iVar42 = -(uint)(iVar43 < auVar28._8_4_);
          auVar31._12_4_ = -(uint)(iVar19 < auVar28._12_4_);
          auVar36._4_4_ = iVar38;
          auVar36._0_4_ = iVar38;
          auVar36._8_4_ = iVar42;
          auVar36._12_4_ = iVar42;
          auVar25 = pshuflw(auVar25,auVar36,0xe8);
          auVar30._4_4_ = -(uint)(auVar28._4_4_ == iVar10);
          auVar30._12_4_ = -(uint)(auVar28._12_4_ == iVar19);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          in_XMM9 = pshuflw(auVar46 & auVar44,auVar30,0xe8);
          in_XMM9 = in_XMM9 & auVar25;
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar25 = pshuflw(auVar25,auVar31,0xe8);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar25 | in_XMM9) ^ auVar44;
          auVar25 = packssdw(auVar44,auVar44);
          if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pUVar3[uVar13 + 4] = 0x400;
          }
          auVar31 = auVar30 & auVar36 | auVar31;
          auVar25 = packssdw(auVar31,auVar31);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar25 = packssdw(auVar25 ^ auVar46,auVar25 ^ auVar46);
          if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pUVar3[uVar13 + 5] = 0x400;
          }
          auVar25 = auVar24 ^ auVar6;
          iVar39 = -(uint)(iVar39 < auVar25._0_4_);
          auVar41._4_4_ = -(uint)(iVar10 < auVar25._4_4_);
          iVar43 = -(uint)(iVar43 < auVar25._8_4_);
          auVar41._12_4_ = -(uint)(iVar19 < auVar25._12_4_);
          auVar32._4_4_ = iVar39;
          auVar32._0_4_ = iVar39;
          auVar32._8_4_ = iVar43;
          auVar32._12_4_ = iVar43;
          auVar37._4_4_ = -(uint)(auVar25._4_4_ == iVar10);
          auVar37._12_4_ = -(uint)(auVar25._12_4_ == iVar19);
          auVar37._0_4_ = auVar37._4_4_;
          auVar37._8_4_ = auVar37._12_4_;
          auVar41._0_4_ = auVar41._4_4_;
          auVar41._8_4_ = auVar41._12_4_;
          auVar25 = auVar37 & auVar32 | auVar41;
          auVar25 = packssdw(auVar25,auVar25);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar25 ^ auVar5,auVar25 ^ auVar5);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pUVar3[uVar13 + 6] = 0x400;
          }
          auVar25 = pshufhw(auVar32,auVar32,0x84);
          auVar26 = pshufhw(auVar37,auVar37,0x84);
          auVar28 = pshufhw(auVar25,auVar41,0x84);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar33 = (auVar28 | auVar26 & auVar25) ^ auVar33;
          auVar25 = packssdw(auVar33,auVar33);
          if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pUVar3[uVar13 + 7] = 0x400;
          }
          uVar13 = uVar13 + 8;
          lVar21 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 8;
          auVar20._8_8_ = lVar21 + 8;
          lVar21 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 8;
          auVar22._8_8_ = lVar21 + 8;
          lVar21 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 8;
          auVar23._8_8_ = lVar21 + 8;
          lVar21 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 8;
          auVar24._8_8_ = lVar21 + 8;
        } while (((ulong)(uVar8 + 0x700) | 0x38) != uVar13);
        p->reps[3] = 1;
        p->state = 0;
        p->reps[0] = 1;
        p->reps[1] = 1;
        p->reps[2] = 1;
        p->needInitState = 0;
      }
      uVar8 = p->tempBufSize;
      uVar13 = (ulong)uVar8;
      if (uVar13 == 0) {
        if (inSize < 0x14 || dicLimit <= uVar12) {
          EVar9 = LzmaDec_TryDummy(p,src,inSize);
          if (EVar9 == DUMMY_ERROR) {
            memcpy(buf,src,inSize);
            p->tempBufSize = (uint)inSize;
            *srcLen = *srcLen + inSize;
            goto LAB_0019cc43;
          }
          pBVar14 = src;
          if ((dicLimit <= uVar12) && (EVar9 != DUMMY_MATCH)) goto LAB_0019cbf6;
        }
        else {
          pBVar14 = src + (inSize - 0x14);
        }
        p->buf = src;
        iVar39 = LzmaDec_DecodeReal2(p,dicLimit,pBVar14);
        if (iVar39 != 0) {
          return 1;
        }
        uVar12 = (long)p->buf - (long)src;
        *srcLen = *srcLen + uVar12;
      }
      else {
        iVar39 = 0;
        bVar17 = uVar8 < 0x14;
        if (bVar17) {
          uVar15 = 0;
          if (inSize != 0) {
            uVar15 = 0;
            do {
              pBVar14 = src + uVar15;
              uVar15 = uVar15 + 1;
              buf[uVar13] = *pBVar14;
              bVar17 = uVar13 < 0x13;
              if (!bVar17) break;
              uVar13 = uVar13 + 1;
            } while (uVar15 < inSize);
            iVar39 = (int)uVar15;
            uVar13 = (ulong)(uVar8 + iVar39);
          }
        }
        else {
          uVar15 = 0;
        }
        p->tempBufSize = (uint)uVar13;
        if (!(bool)(uVar12 < dicLimit & (bVar17 ^ 1U))) {
          EVar9 = LzmaDec_TryDummy(p,buf,uVar13);
          if (EVar9 == DUMMY_ERROR) {
            *srcLen = *srcLen + uVar15;
LAB_0019cc43:
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return 0;
          }
          if ((dicLimit <= uVar12) && (EVar9 != DUMMY_MATCH)) {
LAB_0019cbf6:
            *status = LZMA_STATUS_NOT_FINISHED;
            return 1;
          }
        }
        p->buf = buf;
        iVar10 = LzmaDec_DecodeReal2(p,dicLimit,buf);
        if (iVar10 != 0) {
          return 1;
        }
        uVar12 = (ulong)((iVar39 - (uint)uVar13) + (*(int *)&p->buf - (int)buf));
        *srcLen = *srcLen + uVar12;
        p->tempBufSize = 0;
      }
      src = src + uVar12;
      inSize = inSize - uVar12;
      uVar8 = p->remainLen;
    } while (uVar8 != 0x112);
  }
  UVar2 = p->code;
  if (UVar2 == 0) {
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  }
  return (uint)(UVar2 != 0);
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec* p, SizeT dicLimit, const Byte* src, SizeT* srcLen,
                         ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);

  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart) {
    int checkEndMarkNow;

    if (p->needFlush != 0) {
      for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
        p->tempBuf[p->tempBufSize++] = *src++;
      if (p->tempBufSize < RC_INIT_SIZE) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      if (p->tempBuf[0] != 0)
        return SZ_ERROR_DATA;

      LzmaDec_InitRc(p, p->tempBuf);
      p->tempBufSize = 0;
    }

    checkEndMarkNow = 0;
    if (p->dicPos >= dicLimit) {
      if (p->remainLen == 0 && p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return SZ_OK;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_OK;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_ERROR_DATA;
      }
      checkEndMarkNow = 1;
    }

    if (p->needInitState)
      LzmaDec_InitStateReal(p);

    if (p->tempBufSize == 0) {
      SizeT processed;
      const Byte* bufLimit;
      if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, src, inSize);
        if (dummyRes == DUMMY_ERROR) {
          memcpy(p->tempBuf, src, inSize);
          p->tempBufSize = (unsigned)inSize;
          (*srcLen) += inSize;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        bufLimit = src;
      } else
        bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
      p->buf = src;
      if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
        return SZ_ERROR_DATA;
      processed = (SizeT)(p->buf - src);
      (*srcLen) += processed;
      src += processed;
      inSize -= processed;
    } else {
      unsigned rem = p->tempBufSize, lookAhead = 0;
      while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
        p->tempBuf[rem++] = src[lookAhead++];
      p->tempBufSize = rem;
      if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
        if (dummyRes == DUMMY_ERROR) {
          (*srcLen) += lookAhead;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
      }
      p->buf = p->tempBuf;
      if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
        return SZ_ERROR_DATA;
      lookAhead -= (rem - (unsigned)(p->buf - p->tempBuf));
      (*srcLen) += lookAhead;
      src += lookAhead;
      inSize -= lookAhead;
      p->tempBufSize = 0;
    }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}